

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O2

size_t __thiscall Apt::GetEdgeBetweenNodes(Apt *this,size_t idxA,size_t idxB)

{
  pointer pTVar1;
  unsigned_long uVar2;
  reference pvVar3;
  pointer puVar4;
  size_t sVar5;
  
  pvVar3 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::at(&this->vecTaxiNodes,idxA);
  puVar4 = (pvVar3->vecEdges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (puVar4 == (pvVar3->vecEdges).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return 0xfffffffffffffffe;
    }
    uVar2 = *puVar4;
    sVar5 = pTVar1[uVar2].a;
    if (sVar5 == idxA) {
      sVar5 = pTVar1[uVar2].b;
    }
    puVar4 = puVar4 + 1;
  } while (sVar5 != idxB);
  return uVar2;
}

Assistant:

size_t GetEdgeBetweenNodes (size_t idxA, size_t idxB)
    {
        const TaxiNode& a = vecTaxiNodes.at(idxA);
        for (size_t idxE: a.vecEdges) {
            const TaxiEdge& e = vecTaxiEdges[idxE];
            if (e.otherNode(idxA) == idxB)
                return idxE;
        }
        return EDGE_UNAVAIL;
    }